

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subset.hpp
# Opt level: O2

bool ut11::Operands::IsIterableContainingSubset<std::vector<int,std::allocator<int>>>::
     CompareListsAndRemoveFirstDuplicate<std::__cxx11::list<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::allocator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>,std::__cxx11::list<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::allocator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>>
               (list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                *a,list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *b)

{
  const_iterator __position;
  const_iterator __position_00;
  
  __position_00._M_node = (_List_node_base *)a;
  do {
    __position_00._M_node = (__position_00._M_node)->_M_next;
    __position._M_node = (_List_node_base *)b;
    if (__position_00._M_node == (_List_node_base *)a) {
LAB_00219168:
      return __position_00._M_node != (_List_node_base *)a;
    }
    while (__position._M_node = (__position._M_node)->_M_next,
          __position._M_node != (_List_node_base *)b) {
      if (*(int *)&(__position_00._M_node[1]._M_next)->_M_next ==
          *(int *)&(__position._M_node[1]._M_next)->_M_next) {
        std::__cxx11::
        list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::erase(a,__position_00);
        std::__cxx11::
        list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::erase(b,__position);
        goto LAB_00219168;
      }
    }
  } while( true );
}

Assistant:

static bool CompareListsAndRemoveFirstDuplicate(A& a, B& b)
			{
				for(auto i = a.begin(); i != a.end(); ++i)
					for(auto j = b.begin(); j != b.end(); ++j)
						if ( utility::AreEqual(**i, **j) )
						{
							a.erase(i);
							b.erase(j);
							return true;
						}

				return false;
			}